

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O2

void asmjit::_SetBits(size_t *buf,size_t index,size_t len)

{
  sbyte sVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (len != 0) {
    uVar3 = (ulong)((uint)index & 0x3f);
    uVar4 = 0x40 - uVar3;
    if (len <= uVar4) {
      uVar4 = len;
    }
    sVar1 = ((byte)uVar4 < 0x41) * ('@' - (byte)uVar4);
    puVar2 = buf + (index >> 6) + 1;
    puVar2[-1] = puVar2[-1] | ((ulong)(-1L << sVar1) >> sVar1) << uVar3;
    for (uVar4 = len - uVar4; 0x3f < uVar4; uVar4 = uVar4 - 0x40) {
      *puVar2 = 0xffffffffffffffff;
      puVar2 = puVar2 + 1;
    }
    if (uVar4 != 0) {
      sVar1 = ((byte)uVar4 < 0x41) * ('@' - (byte)uVar4);
      *puVar2 = *puVar2 | (ulong)(-1L << sVar1) >> sVar1;
    }
  }
  return;
}

Assistant:

static void _SetBits(size_t* buf, size_t index, size_t len) noexcept {
  if (len == 0)
    return;

  size_t i = index / kBitsPerEntity; // size_t[]
  size_t j = index % kBitsPerEntity; // size_t[][] bit index

  // How many bytes process in the first group.
  size_t c = kBitsPerEntity - j;
  if (c > len)
    c = len;

  // Offset.
  buf += i;

  *buf++ |= ((~(size_t)0) >> (kBitsPerEntity - c)) << j;
  len -= c;

  while (len >= kBitsPerEntity) {
    *buf++ = ~(size_t)0;
    len -= kBitsPerEntity;
  }

  if (len)
    *buf |= ((~(size_t)0) >> (kBitsPerEntity - len));
}